

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImGui::GetKeyPressedAmount(ImGuiKey key,float repeat_delay,float repeat_rate)

{
  int iVar1;
  ImGuiKeyData *pIVar2;
  
  pIVar2 = GetKeyData(key);
  if (pIVar2->Down == true) {
    iVar1 = CalcTypematicRepeatAmount
                      (pIVar2->DownDuration - (GImGui->IO).DeltaTime,pIVar2->DownDuration,
                       repeat_delay,repeat_rate);
    return iVar1;
  }
  return 0;
}

Assistant:

int ImGui::GetKeyPressedAmount(ImGuiKey key, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return 0;
    const float t = key_data->DownDuration;
    return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, repeat_delay, repeat_rate);
}